

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniquePtrVector.h
# Opt level: O3

void __thiscall
dg::vr::UniquePtrVector<dg::vr::VRLocation>::emplace_back<unsigned_long>
          (UniquePtrVector<dg::vr::VRLocation> *this,unsigned_long *args)

{
  iterator __position;
  _Rb_tree_header *p_Var1;
  _Head_base<0UL,_dg::vr::VRLocation_*,_false> local_18;
  
  local_18._M_head_impl = (VRLocation *)operator_new(0x140);
  (local_18._M_head_impl)->id = (uint)*args;
  ((local_18._M_head_impl)->relations).graph.reported = &(local_18._M_head_impl)->relations;
  p_Var1 = (_Rb_tree_header *)((long)&((local_18._M_head_impl)->relations).graph + 0x10);
  (((_Rb_tree_header *)((long)&((local_18._M_head_impl)->relations).graph + 0x10))->_M_header).
  _M_color = _S_red;
  *(_Base_ptr *)((long)&((local_18._M_head_impl)->relations).graph + 0x18) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)((long)&((local_18._M_head_impl)->relations).graph + 0x20) = p_Var1;
  *(_Rb_tree_header **)((long)&((local_18._M_head_impl)->relations).graph + 0x28) = p_Var1;
  *(pointer *)((long)&((local_18._M_head_impl)->relations).graph + 0x50) = (pointer)0x0;
  *(undefined8 *)
   &(((vector<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
       *)((long)&((local_18._M_head_impl)->relations).graph + 0x40))->
    super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
    )._M_impl = 0;
  *(pointer *)((long)&((local_18._M_head_impl)->relations).graph + 0x48) = (pointer)0x0;
  *(size_t *)((long)&((local_18._M_head_impl)->relations).graph + 0x30) = 0;
  *(size_t *)((long)&((local_18._M_head_impl)->relations).graph + 0x38) = 0;
  p_Var1 = (_Rb_tree_header *)((long)&((local_18._M_head_impl)->relations).valToBucket + 8);
  (((_Rb_tree_header *)((long)&((local_18._M_head_impl)->relations).valToBucket + 8))->_M_header).
  _M_color = _S_red;
  *(_Base_ptr *)((long)&((local_18._M_head_impl)->relations).valToBucket + 0x10) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)((long)&((local_18._M_head_impl)->relations).valToBucket + 0x18) = p_Var1;
  *(_Rb_tree_header **)((long)&((local_18._M_head_impl)->relations).valToBucket + 0x20) = p_Var1;
  *(size_t *)((long)&((local_18._M_head_impl)->relations).valToBucket + 0x28) = 0;
  p_Var1 = (_Rb_tree_header *)((long)&((local_18._M_head_impl)->relations).bucketToVals + 8);
  (((_Rb_tree_header *)((long)&((local_18._M_head_impl)->relations).bucketToVals + 8))->_M_header).
  _M_color = _S_red;
  *(_Base_ptr *)((long)&((local_18._M_head_impl)->relations).bucketToVals + 0x10) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)((long)&((local_18._M_head_impl)->relations).bucketToVals + 0x18) = p_Var1;
  *(_Rb_tree_header **)((long)&((local_18._M_head_impl)->relations).bucketToVals + 0x20) = p_Var1;
  (((_Bit_iterator *)((long)&((local_18._M_head_impl)->relations).validAreas + 0x10))->
  super__Bit_iterator_base)._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&((local_18._M_head_impl)->relations).validAreas + 0x18) = 0;
  *(_Bit_pointer *)((long)&((local_18._M_head_impl)->relations).validAreas + 0x20) =
       (_Bit_pointer)0x0;
  ((local_18._M_head_impl)->relations).changed = false;
  *(uint *)((long)&((local_18._M_head_impl)->relations).validAreas + 8) = 0;
  *(size_t *)((long)&((local_18._M_head_impl)->relations).bucketToVals + 0x28) = 0;
  *(undefined8 *)
   &((local_18._M_head_impl)->relations).validAreas.super__Bvector_base<std::allocator<bool>_>.
    _M_impl = 0;
  *(undefined8 *)
   &((local_18._M_head_impl)->predecessors).
    super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>._M_impl = 0;
  *(pointer *)
   ((long)&((local_18._M_head_impl)->predecessors).
           super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_> + 8) =
       (pointer)0x0;
  *(pointer *)
   ((long)&((local_18._M_head_impl)->predecessors).
           super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_> + 0x10) =
       (pointer)0x0;
  *(undefined8 *)
   &((local_18._M_head_impl)->successors).
    super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
    ._M_impl = 0;
  *(pointer *)
   ((long)&((local_18._M_head_impl)->successors).
           super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
   + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&((local_18._M_head_impl)->successors).
           super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
   + 0x10) = (pointer)0x0;
  *(undefined8 *)
   &((local_18._M_head_impl)->loopEnds).
    super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>._M_impl = 0;
  *(pointer *)
   ((long)&((local_18._M_head_impl)->loopEnds).
           super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> + 8)
       = (pointer)0x0;
  *(pointer *)
   ((long)&((local_18._M_head_impl)->loopEnds).
           super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> +
   0x10) = (pointer)0x0;
  (local_18._M_head_impl)->join = (VRLocation *)0x0;
  __position._M_current =
       *(unique_ptr<dg::vr::VRLocation,_std::default_delete<dg::vr::VRLocation>_> **)
        &this->field_0x8;
  if (__position._M_current ==
      *(unique_ptr<dg::vr::VRLocation,_std::default_delete<dg::vr::VRLocation>_> **)
       &this->field_0x10) {
    std::
    vector<std::unique_ptr<dg::vr::VRLocation,std::default_delete<dg::vr::VRLocation>>,std::allocator<std::unique_ptr<dg::vr::VRLocation,std::default_delete<dg::vr::VRLocation>>>>
    ::_M_realloc_insert<dg::vr::VRLocation*>
              ((vector<std::unique_ptr<dg::vr::VRLocation,std::default_delete<dg::vr::VRLocation>>,std::allocator<std::unique_ptr<dg::vr::VRLocation,std::default_delete<dg::vr::VRLocation>>>>
                *)this,__position,&local_18._M_head_impl);
  }
  else {
    ((__position._M_current)->_M_t).
    super___uniq_ptr_impl<dg::vr::VRLocation,_std::default_delete<dg::vr::VRLocation>_>._M_t.
    super__Tuple_impl<0UL,_dg::vr::VRLocation_*,_std::default_delete<dg::vr::VRLocation>_>.
    super__Head_base<0UL,_dg::vr::VRLocation_*,_false>._M_head_impl = local_18._M_head_impl;
    *(long *)&this->field_0x8 = *(long *)&this->field_0x8 + 8;
  }
  return;
}

Assistant:

void emplace_back(Args &&...args) {
        _v.emplace_back(new T(std::forward<Args>(args)...));
    }